

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O3

void __thiscall
diy::Master::foreach<diy::detail::ReductionFunctor<Block,diy::detail::KDTreePartners>>
          (Master *this,ReductionFunctor<Block,_diy::detail::KDTreePartners> *f,Skip *s)

{
  _Any_data _Stack_38;
  _Manager_type local_28;
  
  std::function<void(Block*,diy::Master::ProxyWithLink_const&)>::
  function<diy::detail::ReductionFunctor<Block,diy::detail::KDTreePartners>const&,void>
            ((function<void(Block*,diy::Master::ProxyWithLink_const&)> *)_Stack_38._M_pod_data,f);
  foreach_<Block>(this,(Callback<Block> *)&_Stack_38,s);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return;
}

Assistant:

void          foreach(const F& f, const Skip& s = NeverSkip())
      {
          using Block = typename detail::block_traits<F>::type;
          foreach_<Block>(f, s);
      }